

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol-reader2.hpp
# Opt level: O2

int mp::Lget(char **sp,int *Lp)

{
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint uVar4;
  
  pbVar3 = (byte *)*sp;
  do {
    bVar1 = *pbVar3;
    pbVar3 = pbVar3 + 1;
  } while (bVar1 == 0x20);
  iVar2 = 1;
  if (0xf5 < (byte)(bVar1 - 0x3a)) {
    uVar4 = (uint)(byte)(bVar1 - 0x30);
    for (; (byte)(*pbVar3 - 0x30) < 10; pbVar3 = pbVar3 + 1) {
      uVar4 = (uVar4 * 10 + (uint)*pbVar3) - 0x30;
    }
    *Lp = uVar4;
    *sp = (char *)pbVar3;
    bVar1 = *pbVar3;
    if (((bVar1 != 0) && (bVar1 != 10)) && (bVar1 != 0x20)) {
      if (bVar1 != 0xd) {
        return 1;
      }
      if (pbVar3[1] != 10) {
        return 1;
      }
      *sp = (char *)(pbVar3 + 1);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

inline int
Lget(char **sp, int *Lp)
{
  int c;
  int L = 0;
  char *s = *sp;
  while(*s == ' ')
    s++;
  if ((c = *s++) < '0' || c > '9')
    return 1;
  L = c - '0';
  while((c = *s) >= '0' && c <= '9') {
    L = 10*L + c - '0';
    s++;
  }
  *Lp = L;
  *sp = s;
  switch(*s) {
  case '\r':
    if (*++s != '\n')
      break;
    *sp = s;
    /* no break */
  case 0:
  case ' ':
  case '\n':
    return 0;
  }
  return 1;
}